

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::
InitDefaultSignature<Diligent::SHADER_TYPE,bool>
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,
          PipelineResourceSignatureDesc *SignDesc,SHADER_TYPE *ExtraArgs,bool *ExtraArgs_1)

{
  RenderDeviceVkImpl *this_00;
  char (*Args_1) [48];
  SignatureAutoPtrType *this_01;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> pImplicitSignature;
  string msg;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> local_50;
  string local_48;
  
  if ((this->m_SignatureCount != '\x01') || (this->m_UsingImplicitSignature == false)) {
    FormatString<char[26],char[50]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_SignatureCount == 1 && m_UsingImplicitSignature",
               (char (*) [50])ExtraArgs_1);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"InitDefaultSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x478);
    std::__cxx11::string::~string((string *)&local_48);
  }
  local_50.m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  this_00 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                       );
  local_48._M_dataplus._M_p = (Char *)0x0;
  local_48._M_string_length = (size_type)&local_50;
  Args_1 = (char (*) [48])(ulong)*ExtraArgs;
  RenderDeviceVkImpl::CreatePipelineResourceSignature
            (this_00,SignDesc,(IPipelineResourceSignature **)&local_48,*ExtraArgs,*ExtraArgs_1);
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::
  DoublePtrHelper<Diligent::IPipelineResourceSignature>::~DoublePtrHelper
            ((DoublePtrHelper<Diligent::IPipelineResourceSignature> *)&local_48);
  if (local_50.m_pObject == (PipelineResourceSignatureVkImpl *)0x0) {
    Args_1 = (char (*) [48])0x47e;
    LogError<true,char[66],char_const*,char[3]>
              (false,"InitDefaultSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x47e,(char (*) [66])
                      "Failed to create implicit resource signature for pipeline state \'",
               (char **)&(this->
                         super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                         ).m_Desc,(char (*) [3])"\'.");
  }
  if (((local_50.m_pObject)->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      .m_Desc.BindingIndex != '\0') {
    FormatString<char[26],char[48]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pImplicitSignature->GetDesc().BindingIndex == 0",Args_1);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"InitDefaultSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x480);
    std::__cxx11::string::~string((string *)&local_48);
  }
  this_01 = this->m_Signatures;
  if (this_01->m_pObject != (PipelineResourceSignatureVkImpl *)0x0) {
    FormatString<char[42]>(&local_48,(char (*) [42])"Signature 0 has already been initialized.");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"InitDefaultSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x481);
    std::__cxx11::string::~string((string *)&local_48);
    this_01 = this->m_Signatures;
  }
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator=(this_01,&local_50);
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::Release(&local_50);
  return;
}

Assistant:

void InitDefaultSignature(const PipelineResourceSignatureDesc& SignDesc,
                              const ExtraArgsType&... ExtraArgs)
    {
        VERIFY_EXPR(m_SignatureCount == 1 && m_UsingImplicitSignature);

        RefCntAutoPtr<PipelineResourceSignatureImplType> pImplicitSignature;
        this->GetDevice()->CreatePipelineResourceSignature(SignDesc, pImplicitSignature.template DblPtr<IPipelineResourceSignature>(), ExtraArgs...);

        if (!pImplicitSignature)
            LOG_ERROR_AND_THROW("Failed to create implicit resource signature for pipeline state '", this->m_Desc.Name, "'.");

        VERIFY_EXPR(pImplicitSignature->GetDesc().BindingIndex == 0);
        VERIFY(!m_Signatures[0], "Signature 0 has already been initialized.");
        m_Signatures[0] = std::move(pImplicitSignature);
    }